

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
unitStrings_siPrefixesStrict_Test::~unitStrings_siPrefixesStrict_Test
          (unitStrings_siPrefixesStrict_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStrings, siPrefixesStrict)
{
    EXPECT_EQ(to_string(unit_from_string("mm", strict_si)), "mm");
    EXPECT_EQ(to_string(unit_from_string("mF", strict_si)), "mF");
    EXPECT_EQ(to_string(unit_from_string("cm", strict_si)), "cm");
    EXPECT_EQ(to_string(unit_from_string("um", strict_si)), "um");
    EXPECT_EQ(to_string(unit_from_string("nm", strict_si)), "nm");
    EXPECT_EQ(to_string(unit_from_string("ng", strict_si)), "ng");
    EXPECT_EQ(to_string(unit_from_string("cL", strict_si)), "cL");
    EXPECT_EQ(to_string(unit_from_string("h$", strict_si)), "100$");
    EXPECT_EQ(to_string(unit_from_string("pm", strict_si)), "pm");
    EXPECT_EQ(to_string(unit_from_string("fm", strict_si)), "fm");
    EXPECT_EQ(to_string(unit_from_string("am", strict_si)), "am");
    EXPECT_EQ(to_string(unit_from_string("zm", strict_si)), "zm");
    EXPECT_EQ(to_string(unit_from_string("ym", strict_si)), "ym");
    EXPECT_EQ(to_string(unit_from_string("dm", strict_si)), "dm");
    EXPECT_EQ(to_string(unit_from_string("rm", strict_si)), "rm");
    EXPECT_EQ(to_string(unit_from_string("qm", strict_si)), "qm");

    EXPECT_EQ(to_string(unit_from_string("km", strict_si)), "km");
    EXPECT_EQ(to_string(unit_from_string("kA", strict_si)), "kA");
    EXPECT_EQ(to_string(unit_from_string("Mm", strict_si)), "Mm");
    EXPECT_EQ(to_string(unit_from_string("Gm", strict_si)), "Gm");
    EXPECT_EQ(to_string(unit_from_string("Tm", strict_si)), "Tm");
    EXPECT_EQ(to_string(unit_from_string("Pm", strict_si)), "Pm");
    EXPECT_EQ(to_string(unit_from_string("Em", strict_si)), "Em");
    EXPECT_EQ(to_string(unit_from_string("Zm", strict_si)), "Zm");
    EXPECT_EQ(to_string(unit_from_string("Ym", strict_si)), "Ym");
    EXPECT_EQ(to_string(unit_from_string("Rm", strict_si)), "Rm");
    EXPECT_EQ(to_string(unit_from_string("Qm", strict_si)), "Qm");
}